

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

void __thiscall Timidity::GF1Envelope::ApplyToAmp(GF1Envelope *this,Voice *v)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  
  dVar3 = (double)v->attenuation;
  if (v->tremolo_phase_increment != 0) {
    dVar3 = dVar3 * (double)v->tremolo_volume;
  }
  dVar3 = exp2(dVar3 * 16.0 * (double)((float)this->volume * 9.313226e-10) + -16.0);
  uVar1 = v->left_offset;
  uVar2 = v->right_offset;
  v->left_mix = (float)(dVar3 * 0.5 * (double)(float)uVar1);
  v->right_mix = (float)(dVar3 * 0.5 * (double)(float)uVar2);
  return;
}

Assistant:

void GF1Envelope::ApplyToAmp(Voice *v)
{
	double env_vol = v->attenuation;
	double final_amp;

	final_amp = FINAL_MIX_SCALE;
	if (v->tremolo_phase_increment != 0)
	{ // [RH] FIXME: This is wrong. Tremolo should offset the
	  // envelope volume, not scale it.
		env_vol *= v->tremolo_volume;
	}
	env_vol *= volume / float(1 << 30);
	env_vol = calc_gf1_amp(env_vol);
	env_vol *= final_amp;
	v->left_mix = float(env_vol * v->left_offset);
	v->right_mix = float(env_vol * v->right_offset);
}